

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t __thiscall Catch::clara::TextFlow::Column::iterator::indent(iterator *this)

{
  size_t local_28;
  size_t local_20;
  unsigned_long initial;
  iterator *this_local;
  
  if ((this->m_pos == 0) && (this->m_stringIndex == 0)) {
    local_20 = this->m_column->m_initialIndent;
  }
  else {
    local_20 = 0xffffffffffffffff;
  }
  if (local_20 == 0xffffffffffffffff) {
    local_28 = this->m_column->m_indent;
  }
  else {
    local_28 = local_20;
  }
  return local_28;
}

Assistant:

auto indent() const -> size_t {
			auto initial = m_pos == 0 && m_stringIndex == 0 ? m_column.m_initialIndent : std::string::npos;
			return initial == std::string::npos ? m_column.m_indent : initial;
		}